

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::SetCamera(ON_Viewport *this,ON_Viewport *source_viewport,bool bBreakLocks)

{
  ON_3dPoint local_68;
  ON_3dVector local_50;
  ON_3dVector local_38;
  undefined1 local_19;
  ON_Viewport *pOStack_18;
  bool bBreakLocks_local;
  ON_Viewport *source_viewport_local;
  ON_Viewport *this_local;
  
  local_19 = bBreakLocks;
  pOStack_18 = source_viewport;
  source_viewport_local = this;
  if (bBreakLocks) {
    SetCameraDirectionLock(this,false);
    SetCameraUpLock(this,false);
    SetCameraLocationLock(this,false);
  }
  CameraDirection(&local_38,pOStack_18);
  SetCameraDirection(this,&local_38);
  CameraUp(&local_50,pOStack_18);
  SetCameraUp(this,&local_50);
  CameraLocation(&local_68,pOStack_18);
  SetCameraLocation(this,&local_68);
  return (bool)(this->m_bValidCamera & 1);
}

Assistant:

bool ON_Viewport::SetCamera(
  const ON_Viewport& source_viewport,
  bool bBreakLocks
)
{
  if (bBreakLocks)
  {
    SetCameraDirectionLock(false);
    SetCameraUpLock(false);
    SetCameraLocationLock(false);
  }

  SetCameraDirection(source_viewport.CameraDirection());
  SetCameraUp(source_viewport.CameraUp());
  SetCameraLocation(source_viewport.CameraLocation());

  return m_bValidCamera;
}